

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O0

void __thiscall HEkkDual::majorUpdateFtranParallel(HEkkDual *this)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  double local_row_DSE_density;
  double local_col_aq_density;
  HVector *Row_1;
  HVector *Col_1;
  MFinish *finish_1;
  HighsInt iFn_3;
  HVector *Row;
  HVector *Col;
  MFinish *finish;
  HighsInt iFn_2;
  HighsInt iFn_1;
  HighsInt iFn;
  HVector_ptr multi_vector [17];
  double multi_density [17];
  HighsInt multi_ntasks;
  double in_stack_fffffffffffffe68;
  HighsSimplexAnalysis *in_stack_fffffffffffffe70;
  HighsInt in_stack_fffffffffffffe94;
  int iVar3;
  anon_class_24_3_04dd5b7a *in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int local_14c;
  int local_130;
  int local_12c;
  long local_128 [18];
  undefined8 local_98 [17];
  int local_c;
  
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             SUB84(in_stack_fffffffffffffe68,0));
  local_c = 0;
  if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordBefore
              (*(HighsSimplexAnalysis **)(in_RDI + 0x40),7,*(HighsInt *)(in_RDI + 0x304),
               *(double *)(*(long *)(in_RDI + 0x10) + 0x2840));
  }
  local_98[local_c] = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x2840);
  local_128[local_c] = in_RDI + 0x300;
  local_c = local_c + 1;
  if (*(int *)(in_RDI + 0xac) == 2) {
    for (local_12c = 0; local_12c < *(int *)(in_RDI + 0x14cc); local_12c = local_12c + 1) {
      if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
        HighsSimplexAnalysis::operationRecordBefore
                  (*(HighsSimplexAnalysis **)(in_RDI + 0x40),8,
                   *(HighsInt *)(*(long *)(in_RDI + (long)local_12c * 0x78 + 0x2778) + 4),
                   *(double *)(*(long *)(in_RDI + 0x10) + 0x2858));
      }
      local_98[local_c] = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x2858);
      local_128[local_c] = *(long *)(in_RDI + (long)local_12c * 0x78 + 0x2778);
      local_c = local_c + 1;
    }
  }
  for (local_130 = 0; local_130 < *(int *)(in_RDI + 0x14cc); local_130 = local_130 + 1) {
    if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
      HighsSimplexAnalysis::operationRecordBefore
                (*(HighsSimplexAnalysis **)(in_RDI + 0x40),6,
                 *(HighsInt *)(*(long *)(in_RDI + (long)local_130 * 0x78 + 0x2780) + 4),
                 *(double *)(*(long *)(in_RDI + 0x10) + 0x2840));
    }
    local_98[local_c] = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x2840);
    local_128[local_c] = *(long *)(in_RDI + (long)local_130 * 0x78 + 0x2780);
    local_c = local_c + 1;
  }
  ::highs::parallel::for_each<HEkkDual::majorUpdateFtranParallel()::__0>
            ((HighsInt)((ulong)in_stack_fffffffffffffea0 >> 0x20),
             (HighsInt)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94
            );
  for (local_14c = 0; local_14c < *(int *)(in_RDI + 0x14cc); local_14c = local_14c + 1) {
    lVar2 = in_RDI + 0x2718 + (long)local_14c * 0x78;
    lVar1 = *(long *)(lVar2 + 0x60);
    *(double *)(*(long *)(in_RDI + 0x10) + 0x3858) =
         *(double *)(*(long *)(lVar2 + 0x68) + 0x38) +
         *(double *)(*(long *)(in_RDI + 0x10) + 0x3858);
    *(double *)(*(long *)(in_RDI + 0x10) + 0x3858) =
         *(double *)(lVar1 + 0x38) + *(double *)(*(long *)(in_RDI + 0x10) + 0x3858);
  }
  if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
    HighsSimplexAnalysis::operationRecordAfter
              (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
               SUB84(in_stack_fffffffffffffe68,0));
  }
  for (iVar3 = 0; iVar3 < *(int *)(in_RDI + 0x14cc); iVar3 = iVar3 + 1) {
    lVar2 = in_RDI + 0x2718 + (long)iVar3 * 0x78;
    lVar1 = *(long *)(lVar2 + 0x60);
    in_stack_fffffffffffffe70 =
         (HighsSimplexAnalysis *)
         ((double)*(int *)(*(long *)(lVar2 + 0x68) + 4) / (double)*(int *)(in_RDI + 0x18));
    HEkk::updateOperationResultDensity
              (*(HEkk **)(in_RDI + 0x10),(double)in_stack_fffffffffffffe70,
               (double *)(*(long *)(in_RDI + 0x10) + 0x2840));
    if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
      HighsSimplexAnalysis::operationRecordAfter
                (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                 SUB84(in_stack_fffffffffffffe68,0));
    }
    if (*(int *)(in_RDI + 0xac) == 2) {
      in_stack_fffffffffffffe68 = (double)*(int *)(lVar1 + 4) / (double)*(int *)(in_RDI + 0x18);
      HEkk::updateOperationResultDensity
                (*(HEkk **)(in_RDI + 0x10),in_stack_fffffffffffffe68,
                 (double *)(*(long *)(in_RDI + 0x10) + 0x2858));
      if ((*(byte *)(*(long *)(in_RDI + 0x40) + 0xf1) & 1) != 0) {
        HighsSimplexAnalysis::operationRecordAfter
                  (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                   SUB84(in_stack_fffffffffffffe68,0));
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_fffffffffffffe70,(HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             SUB84(in_stack_fffffffffffffe68,0));
  return;
}

Assistant:

void HEkkDual::majorUpdateFtranParallel() {
  analysis->simplexTimerStart(FtranMixParClock);

  // Prepare buffers
  HighsInt multi_ntasks = 0;
  double multi_density[kSimplexConcurrencyLimit * 2 + 1];
  HVector_ptr multi_vector[kSimplexConcurrencyLimit * 2 + 1];
  // BFRT first
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordBefore(kSimplexNlaFtranBfrt, col_BFRT.count,
                                    ekk_instance_.info_.col_aq_density);
  multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
  multi_vector[multi_ntasks] = &col_BFRT;
  multi_ntasks++;
  if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
    // Then DSE
    for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordBefore(kSimplexNlaFtranDse,
                                        multi_finish[iFn].row_ep->count,
                                        ekk_instance_.info_.row_DSE_density);
      multi_density[multi_ntasks] = ekk_instance_.info_.row_DSE_density;
      multi_vector[multi_ntasks] = multi_finish[iFn].row_ep;
      multi_ntasks++;
    }
  }
  // Then Column
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordBefore(kSimplexNlaFtran,
                                      multi_finish[iFn].col_aq->count,
                                      ekk_instance_.info_.col_aq_density);
    multi_density[multi_ntasks] = ekk_instance_.info_.col_aq_density;
    multi_vector[multi_ntasks] = multi_finish[iFn].col_aq;
    multi_ntasks++;
  }

  // Perform FTRAN
  // #pragma omp parallel for schedule(dynamic, 1)
  // printf("majorUpdateFtranParallel: starting %d tasks\n", multi_ntasks);
  highs::parallel::for_each(0, multi_ntasks, [&](HighsInt start, HighsInt end) {
    for (HighsInt i = start; i < end; i++) {
      HVector_ptr rhs = multi_vector[i];
      double density = multi_density[i];
      HighsTimerClock* factor_timer_clock_pointer =
          analysis->getThreadFactorTimerClockPointer();
      ekk_instance_.simplex_nla_.ftran(*rhs, density,
                                       factor_timer_clock_pointer);
    }
  });

  // Update ticks
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    ekk_instance_.total_synthetic_tick_ += Col->synthetic_tick;
    ekk_instance_.total_synthetic_tick_ += Row->synthetic_tick;
  }

  // Update rates
  if (analysis->analyse_simplex_summary_data)
    analysis->operationRecordAfter(kSimplexNlaFtranBfrt, col_BFRT.count);
  for (HighsInt iFn = 0; iFn < multi_nFinish; iFn++) {
    MFinish* finish = &multi_finish[iFn];
    HVector* Col = finish->col_aq;
    HVector* Row = finish->row_ep;
    const double local_col_aq_density = (double)Col->count / solver_num_row;
    ekk_instance_.updateOperationResultDensity(
        local_col_aq_density, ekk_instance_.info_.col_aq_density);
    if (analysis->analyse_simplex_summary_data)
      analysis->operationRecordAfter(kSimplexNlaFtran, Col->count);
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      const double local_row_DSE_density = (double)Row->count / solver_num_row;
      ekk_instance_.updateOperationResultDensity(
          local_row_DSE_density, ekk_instance_.info_.row_DSE_density);
      if (analysis->analyse_simplex_summary_data)
        analysis->operationRecordAfter(kSimplexNlaFtranDse, Row->count);
    }
  }
  analysis->simplexTimerStop(FtranMixParClock);
}